

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

void MAFSA_automaton_enumerate_ints
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               MAFSA_letter delim,void *user_data,MAFSA_automaton_string_handler fetcher)

{
  uint32_t uVar1;
  undefined8 in_RCX;
  MAFSA_stack_struct *in_RDX;
  MAFSA_automaton in_RSI;
  MAFSA_automaton_string_handler in_R8;
  undefined1 in_R9B;
  MAFSA_letter label;
  MAFSA_stack_struct tmp_stack;
  uint32_t where;
  uint32_t current;
  uint32_t i;
  MAFSA_letter label_00;
  uint32_t local_38;
  uint uVar2;
  undefined3 in_stack_ffffffffffffffd4;
  undefined4 uVar3;
  MAFSA_automaton_string_handler fetcher_00;
  undefined8 uVar4;
  uint32_t cstate;
  
  uVar3 = CONCAT13(in_R9B,in_stack_ffffffffffffffd4);
  local_38 = 1;
  uVar2 = 0;
  fetcher_00 = in_R8;
  uVar4 = in_RCX;
  while( true ) {
    cstate = (uint32_t)((ulong)uVar4 >> 0x20);
    label_00 = (MAFSA_letter)((ulong)in_RCX >> 0x18);
    uVar1 = (uint32_t)((ulong)in_RCX >> 0x20);
    if (in_RDX <= (MAFSA_stack_struct *)(ulong)uVar2) break;
    local_38 = MAFSA_delta((uint32_t *)in_R8,uVar1,label_00);
    cstate = (uint32_t)((ulong)uVar4 >> 0x20);
    if (local_38 == 0) break;
    uVar2 = uVar2 + 1;
  }
  if ((((MAFSA_stack_struct *)(ulong)uVar2 == in_RDX) && (local_38 != 0)) &&
     (uVar1 = MAFSA_delta((uint32_t *)in_R8,uVar1,label_00), uVar1 != 0)) {
    enumerate_ints(in_RSI,in_RDX,cstate,fetcher_00,(void *)CONCAT44(uVar3,uVar2));
  }
  return;
}

Assistant:

static void MAFSA_automaton_enumerate_ints(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, MAFSA_letter delim, void *user_data, MAFSA_automaton_string_handler fetcher)
{
    uint32_t i;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 1;

    struct MAFSA_stack_struct tmp_stack;

    tmp_stack.buffer   = tmp;
    tmp_stack.reserved = sz_tmp;
    tmp_stack.current  = -1;

    for (i = 0; i < sz_l; i++)
    {
        MAFSA_letter label = l[i];

        if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if (i == sz_l && where)
    {
        if (0 != (where = MAFSA_delta(ma->ptr_links, current, delim)))
        {
            enumerate_ints(ma, &tmp_stack, ma->ptr_nodes[where], fetcher, user_data);
        }
    }
}